

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.cpp
# Opt level: O2

void __thiscall Document::append_paragraph(Document *this,Paragraph *p)

{
  pointer ppPVar1;
  Paragraph *this_00;
  int iVar2;
  int iVar3;
  size_t sVar4;
  bool local_29;
  Paragraph *local_28;
  
  ppPVar1 = (this->_paragraph).super__Vector_base<Paragraph_*,_std::allocator<Paragraph_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  local_28 = p;
  if ((ppPVar1 ==
       (this->_paragraph).super__Vector_base<Paragraph_*,_std::allocator<Paragraph_*>_>._M_impl.
       super__Vector_impl_data._M_start) || (this_00 = ppPVar1[-1], this_00 == (Paragraph *)0x0)) {
    if (p == (Paragraph *)0x0) {
      return;
    }
  }
  else {
    iVar2 = (*p->_vptr_Paragraph[1])(p);
    iVar3 = (*this_00->_vptr_Paragraph[1])(this_00);
    if (iVar2 < iVar3) {
      local_29 = true;
      Paragraph::last(this_00,&local_29);
    }
  }
  sVar4 = Paragraph::size(p);
  if (sVar4 != 0) {
    std::vector<Paragraph_*,_std::allocator<Paragraph_*>_>::push_back(&this->_paragraph,&local_28);
  }
  return;
}

Assistant:

void Document::append_paragraph(Paragraph * p) {
	Paragraph *last_p(nullptr);

	if (_paragraph.size()) {
		last_p = _paragraph.back();
	}

	if (last_p and p->level() < last_p->level()) {
		last_p->last(true);
	}

	if (p and p->size()) {
		_paragraph.push_back(p);
	}
}